

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenCreateParam_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  Presence PVar1;
  StructDef *pSVar2;
  size_type sVar3;
  bool bVar4;
  BaseType BVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  string *psVar10;
  string *type_2;
  SymbolTable<flatbuffers::Value> *pSVar11;
  string type_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"_o->",(allocator<char> *)&type);
  if ((field->value).type.base_type == BASE_TYPE_UTYPE) {
    Name_abi_cxx11_(&type_1,this,field);
    StripUnionType(&type,this,&type_1);
    std::__cxx11::string::append((string *)&value);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&type_1);
    std::__cxx11::string::append((char *)&value);
  }
  else {
    Name_abi_cxx11_(&type,this,field);
    std::__cxx11::string::append((string *)&value);
    std::__cxx11::string::~string((string *)&type);
  }
  pVVar7 = &field->value;
  BVar5 = (pVVar7->type).base_type;
  if ((BVar5 != BASE_TYPE_VECTOR) && (BVar5 != BASE_TYPE_VECTOR64)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"cpp_type",(allocator<char> *)&type_1);
    pVVar6 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&type);
    std::__cxx11::string::~string((string *)&type);
    if (pVVar6 != (Value *)0x0) {
      GenTypeBasic_abi_cxx11_(&type,this,&pVVar7->type,false);
      std::operator+(&local_d0,"_rehasher ? static_cast<",&type);
      std::operator+(&local_110,&local_d0,">((*_rehasher)(");
      std::operator+(&enum_value,&local_110,&value);
      GenPtrGet_abi_cxx11_(&local_b0,this,field);
      std::operator+(&local_170,&enum_value,&local_b0);
      std::operator+(&type_1,&local_170,")) : 0");
      std::__cxx11::string::operator=((string *)&value,(string *)&type_1);
      std::__cxx11::string::~string((string *)&type_1);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&enum_value);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&type);
    }
    BVar5 = (pVVar7->type).base_type;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(BVar5) {
  case BASE_TYPE_STRING:
    if (field->shared == false) {
      pcVar8 = "";
      if (field->offset64 != false) {
        pcVar8 = "<::flatbuffers::Offset64>";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,pcVar8,(allocator<char> *)&enum_value);
      std::operator+(&type_1,"_fbb.CreateString",&local_170);
      std::operator+(&type,&type_1,"(");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&type_1);
      std::__cxx11::string::~string((string *)&local_170);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    if (field->presence == kRequired) goto LAB_0016f9f2;
    bVar4 = (this->opts_).super_IDLOptions.set_empty_strings_to_null;
    std::operator+(&enum_value,&value,".empty() ? ");
    pcVar8 = "_fbb.CreateSharedString(\"\")";
    if (bVar4 != false) {
      pcVar8 = "0";
    }
    std::operator+(&local_170,&enum_value,pcVar8);
    std::operator+(&type_1,&local_170," : ");
    std::operator+(&type,&type_1,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type);
    std::__cxx11::string::~string((string *)&type);
    psVar10 = &type_1;
    goto LAB_0016f9ad;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    type._M_dataplus._M_p._0_4_ = (field->value).type.element;
    pSVar2 = (field->value).type.struct_def;
    type.field_2._M_allocated_capacity = (size_type)(field->value).type.enum_def;
    type.field_2._8_2_ = (field->value).type.fixed_length;
    type._M_dataplus._M_p._4_4_ = 0;
    type._M_string_length = (size_type)pSVar2;
    if ((BaseType)type._M_dataplus._M_p == BASE_TYPE_UTYPE) {
      StripUnionType(&type_1,this,&value);
      std::__cxx11::string::operator=((string *)&value,(string *)&type_1);
      std::__cxx11::string::~string((string *)&type_1);
      GenTypeBasic_abi_cxx11_(&type_1,this,(Type *)&type,false);
      if ((this->opts_).super_IDLOptions.scoped_enums == true) {
        EscapeKeyword(&local_170,this,(string *)(field->value).type.enum_def);
      }
      else {
        std::__cxx11::string::string((string *)&local_170,(string *)&type_1);
      }
      std::operator+(&local_110,"__va->_",&value);
      std::operator+(&enum_value,&local_110,"[i].type");
      std::__cxx11::string::~string((string *)&local_110);
      if ((this->opts_).super_IDLOptions.scoped_enums == false) {
        std::operator+(&local_90,"static_cast<",&type_1);
        std::operator+(&local_b0,&local_90,">(");
        std::operator+(&local_d0,&local_b0,&enum_value);
        std::operator+(&local_110,&local_d0,")");
        std::__cxx11::string::operator=((string *)&enum_value,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::operator+(&local_70,"_fbb.CreateVector<",&local_170);
      std::operator+(&local_50,&local_70,">(");
      std::operator+(&local_90,&local_50,&value);
      std::operator+(&local_b0,&local_90,".size(), [](size_t i, _VectorArgs *__va) { return ");
      std::operator+(&local_d0,&local_b0,&enum_value);
      std::operator+(&local_110,&local_d0,"; }, &_va)");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&enum_value);
      pbVar9 = &local_170;
LAB_0016f697:
      std::__cxx11::string::~string((string *)pbVar9);
LAB_0016f69c:
      pbVar9 = &type_1;
LAB_0016f921:
      std::__cxx11::string::~string((string *)pbVar9);
    }
    else {
      if ((BaseType)type._M_dataplus._M_p == BASE_TYPE_BOOL) {
        std::operator+(&local_170,"_fbb.CreateVector(",&value);
        std::operator+(&type_1,&local_170,")");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0016f912:
        std::__cxx11::string::~string((string *)&type_1);
        pbVar9 = &local_170;
        goto LAB_0016f921;
      }
      if ((BaseType)type._M_dataplus._M_p == BASE_TYPE_STRING) {
        NativeString_abi_cxx11_(&type_1,this,field);
        bVar4 = std::operator==(&type_1,"std::string");
        std::__cxx11::string::~string((string *)&type_1);
        if (bVar4) {
          std::operator+(&local_170,"_fbb.CreateVectorOfStrings(",&value);
          std::operator+(&type_1,&local_170,")");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_0016f912;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::operator+(&local_170,"(",&value);
        std::operator+(&type_1,&local_170,".size(), ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&type_1);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::operator+(&local_170,"return __va->__fbb->CreateString(__va->_",&value);
        std::operator+(&type_1,&local_170,"[i]);");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&type_1);
        std::__cxx11::string::~string((string *)&local_170);
LAB_0016f828:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((BaseType)type._M_dataplus._M_p != BASE_TYPE_STRUCT) {
          if ((BaseType)type._M_dataplus._M_p != BASE_TYPE_UNION) {
            if (((EnumDef *)type.field_2._M_allocated_capacity != (EnumDef *)0x0) &&
               (bVar4 = VectorElementUserFacing(this,(Type *)&type), !bVar4)) {
              GenTypeBasic_abi_cxx11_
                        (&type_1,this,&((field->value).type.enum_def)->underlying_type,false);
              std::operator+(&local_90,"_fbb.CreateVectorScalarCast<",&type_1);
              std::operator+(&local_b0,&local_90,">(::flatbuffers::data(");
              std::operator+(&local_d0,&local_b0,&value);
              std::operator+(&local_110,&local_d0,"), ");
              std::operator+(&enum_value,&local_110,&value);
              std::operator+(&local_170,&enum_value,".size())");
              std::__cxx11::string::append((string *)__return_storage_ptr__);
              std::__cxx11::string::~string((string *)&local_170);
              std::__cxx11::string::~string((string *)&enum_value);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_b0);
              pbVar9 = &local_90;
              goto LAB_0016f697;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&type_1,"cpp_type",(allocator<char> *)&local_170);
            pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                               (&(field->super_Definition).attributes,&type_1);
            std::__cxx11::string::~string((string *)&type_1);
            if (pVVar6 == (Value *)0x0) {
              if ((pVVar7->type).base_type == BASE_TYPE_VECTOR64) {
                std::operator+(&local_170,"_fbb.CreateVector64(",&value);
                std::operator+(&type_1,&local_170,")");
                std::__cxx11::string::append((string *)__return_storage_ptr__);
              }
              else {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                if (field->offset64 == true) {
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                }
                std::operator+(&local_170,"(",&value);
                std::operator+(&type_1,&local_170,")");
                std::__cxx11::string::append((string *)__return_storage_ptr__);
              }
              goto LAB_0016f912;
            }
            GenTypeBasic_abi_cxx11_(&type_1,this,(Type *)&type,false);
            std::operator+(&local_d0,"_fbb.CreateVector<",&type_1);
            std::operator+(&local_110,&local_d0,">(");
            std::operator+(&enum_value,&local_110,&value);
            std::operator+(&local_170,&enum_value,".size(), ");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&enum_value);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::operator+(&enum_value,"static_cast<",&type_1);
            std::operator+(&local_170,&enum_value,">((*__va->__rehasher)");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&enum_value);
            std::operator+(&local_d0,"(__va->_",&value);
            std::operator+(&local_110,&local_d0,"[i]");
            GenPtrGet_abi_cxx11_(&local_b0,this,field);
            std::operator+(&enum_value,&local_110,&local_b0);
            std::operator+(&local_170,&enum_value,")) : 0");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&enum_value);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            goto LAB_0016f69c;
          }
          std::operator+(&local_110,"_fbb.CreateVector<::flatbuffers::Offset<void>>(",&value);
          std::operator+(&enum_value,&local_110,
                         ".size(), [](size_t i, _VectorArgs *__va) { return __va->_");
          std::operator+(&local_170,&enum_value,&value);
          std::operator+(&type_1,&local_170,"[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va)");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&type_1);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&enum_value);
          pbVar9 = &local_110;
          goto LAB_0016f921;
        }
        if (pSVar2->fixed != true) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          sVar3 = type._M_string_length;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&enum_value,"",(allocator<char> *)&local_110);
          BaseGenerator::WrapInNameSpace
                    (&local_170,&this->super_BaseGenerator,(Definition *)sVar3,&enum_value);
          std::operator+(&type_1,&local_170,">> ");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&type_1);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&enum_value);
          std::operator+(&local_170,"(",&value);
          std::operator+(&type_1,&local_170,".size(), ");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&type_1);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&type_1,"return Create",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         type._M_string_length);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&type_1);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if (field->native_inline == true) {
            std::operator+(&local_170,"&(__va->_",&value);
            std::operator+(&type_1,&local_170,"[i])");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&type_1);
            pbVar9 = &local_170;
          }
          else {
            std::operator+(&enum_value,"__va->_",&value);
            std::operator+(&local_170,&enum_value,"[i]");
            GenPtrGet_abi_cxx11_(&local_110,this,field);
            std::operator+(&type_1,&local_170,&local_110);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&type_1);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_170);
            pbVar9 = &enum_value;
          }
          std::__cxx11::string::~string((string *)pbVar9);
          goto LAB_0016f828;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&type_1,"native_type",(allocator<char> *)&local_170);
        pSVar11 = &(pSVar2->super_Definition).attributes;
        pVVar6 = SymbolTable<flatbuffers::Value>::Lookup(pSVar11,&type_1);
        std::__cxx11::string::~string((string *)&type_1);
        if (pVVar6 == (Value *)0x0) {
          if (((pVVar7->type).base_type == BASE_TYPE_VECTOR64) ||
             (std::__cxx11::string::append((char *)__return_storage_ptr__), field->offset64 == true)
             ) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          std::operator+(&local_170,"(",&value);
          std::operator+(&type_1,&local_170,")");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_0016f912;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        sVar3 = type._M_string_length;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"",(allocator<char> *)&local_b0);
        BaseGenerator::WrapInNameSpace
                  (&local_110,&this->super_BaseGenerator,(Definition *)sVar3,&local_d0);
        std::operator+(&enum_value,&local_110,", ");
        std::operator+(&local_170,&enum_value,&pVVar6->constant);
        std::operator+(&type_1,&local_170,">");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&type_1);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&enum_value);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_d0);
        std::operator+(&type_1,"(",&value);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&type_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&type_1,"native_type_pack_name",(allocator<char> *)&local_170);
        pVVar7 = SymbolTable<flatbuffers::Value>::Lookup(pSVar11,&type_1);
        std::__cxx11::string::~string((string *)&type_1);
        if (pVVar7 != (Value *)0x0) {
          std::operator+(&type_1,", ::flatbuffers::Pack",&pVVar7->constant);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&type_1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type_1,"nested_flatbuffer",(allocator<char> *)&local_170);
    pVVar7 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&type_1);
    if (pVVar7 == (Value *)0x0) {
      if ((this->opts_).super_IDLOptions.set_empty_vectors_to_null != true) goto LAB_0016f9e8;
      PVar1 = field->presence;
      std::__cxx11::string::~string((string *)&type_1);
      if (PVar1 == kRequired) goto LAB_0016f9f2;
    }
    else {
      std::__cxx11::string::~string((string *)&type_1);
    }
    std::operator+(&enum_value,&value,".size() ? ");
    std::operator+(&local_170,&enum_value,__return_storage_ptr__);
    std::operator+(&type_1,&local_170," : 0");
    psVar10 = &type_1;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar10);
LAB_0016f9ad:
    std::__cxx11::string::~string((string *)psVar10);
    std::__cxx11::string::~string((string *)&local_170);
    psVar10 = &enum_value;
    break;
  case BASE_TYPE_STRUCT:
    pSVar2 = (field->value).type.struct_def;
    if (pSVar2->fixed != true) {
      std::operator+(&type_1,&value," ? Create");
      std::operator+(&type,&type_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar2);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&type_1);
      std::operator+(&type,"(_fbb, ",&value);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&type);
      if (field->native_inline == false) {
        GenPtrGet_abi_cxx11_(&type,this,field);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&type);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_0016f9f2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"native_type",(allocator<char> *)&type_1);
    pSVar11 = &(pSVar2->super_Definition).attributes;
    pVVar7 = SymbolTable<flatbuffers::Value>::Lookup(pSVar11,&type);
    std::__cxx11::string::~string((string *)&type);
    if (pVVar7 == (Value *)0x0) {
      if (field->native_inline == true) {
        std::operator+(&type,"&",&value);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        goto LAB_0016e9b1;
      }
      std::operator+(&enum_value,&value," ? ");
      std::operator+(&local_170,&enum_value,&value);
      GenPtrGet_abi_cxx11_(&local_110,this,field);
      std::operator+(&type_1,&local_170,&local_110);
      std::operator+(&type,&type_1," : nullptr");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&type_1);
      psVar10 = &local_110;
      goto LAB_0016f9ad;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"native_type_pack_name",(allocator<char> *)&type_1);
    pVVar7 = SymbolTable<flatbuffers::Value>::Lookup(pSVar11,&type);
    std::__cxx11::string::~string((string *)&type);
    if (pVVar7 != (Value *)0x0) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::operator+(&type_1,"(",&value);
    std::operator+(&type,&type_1,")");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&type);
LAB_0016f9e8:
    psVar10 = &type_1;
    break;
  case BASE_TYPE_UNION:
    std::operator+(&type,&value,".Pack(_fbb)");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0016e9b1:
    psVar10 = &type;
    break;
  default:
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_0016f9f2;
  }
  std::__cxx11::string::~string((string *)psVar10);
LAB_0016f9f2:
  std::__cxx11::string::~string((string *)&value);
  return __return_storage_ptr__;
}

Assistant:

std::string GenCreateParam(const FieldDef &field) {
    std::string value = "_o->";
    if (field.value.type.base_type == BASE_TYPE_UTYPE) {
      value += StripUnionType(Name(field));
      value += ".type";
    } else {
      value += Name(field);
    }
    if (!IsVector(field.value.type) && field.attributes.Lookup("cpp_type")) {
      auto type = GenTypeBasic(field.value.type, false);
      value =
          "_rehasher ? "
          "static_cast<" +
          type + ">((*_rehasher)(" + value + GenPtrGet(field) + ")) : 0";
    }

    std::string code;
    switch (field.value.type.base_type) {
      // String fields are of the form:
      //   _fbb.CreateString(_o->field)
      // or
      //   _fbb.CreateSharedString(_o->field)
      case BASE_TYPE_STRING: {
        if (!field.shared) {
          code +=
              "_fbb.CreateString" +
              std::string(field.offset64 ? "<::flatbuffers::Offset64>" : "") +
              "(";
        } else {
          code += "_fbb.CreateSharedString(";
        }
        code += value;
        code.push_back(')');

        // For optional fields, check to see if there actually is any data
        // in _o->field before attempting to access it. If there isn't,
        // depending on set_empty_strings_to_null either set it to 0 or an empty
        // string.
        if (!field.IsRequired()) {
          auto empty_value = opts_.set_empty_strings_to_null
                                 ? "0"
                                 : "_fbb.CreateSharedString(\"\")";
          code = value + ".empty() ? " + empty_value + " : " + code;
        }
        break;
      }
        // Vector fields come in several flavours, of the forms:
        //   _fbb.CreateVector(_o->field);
        //   _fbb.CreateVector((const utype*)_o->field.data(),
        //   _o->field.size()); _fbb.CreateVectorOfStrings(_o->field)
        //   _fbb.CreateVectorOfStructs(_o->field)
        //   _fbb.CreateVector<Offset<T>>(_o->field.size() [&](size_t i) {
        //     return CreateT(_fbb, _o->Get(i), rehasher);
        //   });
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        auto vector_type = field.value.type.VectorType();
        switch (vector_type.base_type) {
          case BASE_TYPE_STRING: {
            if (NativeString(&field) == "std::string") {
              code += "_fbb.CreateVectorOfStrings(" + value + ")";
            } else {
              // Use by-function serialization to emulate
              // CreateVectorOfStrings(); this works also with non-std strings.
              code +=
                  "_fbb.CreateVector<::flatbuffers::Offset<::flatbuffers::"
                  "String>>"
                  " ";
              code += "(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code +=
                  "return __va->__fbb->CreateString(__va->_" + value + "[i]);";
              code += " }, &_va )";
            }
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (IsStruct(vector_type)) {
              const auto &struct_attrs =
                  field.value.type.struct_def->attributes;
              const auto native_type = struct_attrs.Lookup("native_type");
              if (native_type) {
                code += "_fbb.CreateVectorOfNativeStructs<";
                code += WrapInNameSpace(*vector_type.struct_def) + ", " +
                        native_type->constant + ">";
                code += "(" + value;
                const auto pack_name =
                    struct_attrs.Lookup("native_type_pack_name");
                if (pack_name) {
                  code += ", ::flatbuffers::Pack" + pack_name->constant;
                }
                code += ")";
              } else {
                // If the field uses 64-bit addressing, create a 64-bit vector.
                if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
                  code += "_fbb.CreateVectorOfStructs64";
                } else {
                  code += "_fbb.CreateVectorOfStructs";
                  if (field.offset64) {
                    // This is normal 32-bit vector, with 64-bit addressing.
                    code += "64<::flatbuffers::Vector>";
                  }
                }
                code += "(" + value + ")";
              }
            } else {
              code += "_fbb.CreateVector<::flatbuffers::Offset<";
              code += WrapInNameSpace(*vector_type.struct_def) + ">> ";
              code += "(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code += "return Create" + vector_type.struct_def->name;
              code += "(*__va->__fbb, ";
              if (field.native_inline) {
                code += "&(__va->_" + value + "[i])";
              } else {
                code += "__va->_" + value + "[i]" + GenPtrGet(field);
              }
              code += ", __va->__rehasher); }, &_va )";
            }
            break;
          }
          case BASE_TYPE_BOOL: {
            code += "_fbb.CreateVector(" + value + ")";
            break;
          }
          case BASE_TYPE_UNION: {
            code +=
                "_fbb.CreateVector<::flatbuffers::"
                "Offset<void>>(" +
                value +
                ".size(), [](size_t i, _VectorArgs *__va) { "
                "return __va->_" +
                value + "[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va)";
            break;
          }
          case BASE_TYPE_UTYPE: {
            value = StripUnionType(value);
            auto underlying_type = GenTypeBasic(vector_type, false);
            const std::string &type = opts_.scoped_enums
                                          ? Name(*field.value.type.enum_def)
                                          : underlying_type;
            auto enum_value = "__va->_" + value + "[i].type";
            if (!opts_.scoped_enums)
              enum_value =
                  "static_cast<" + underlying_type + ">(" + enum_value + ")";

            code += "_fbb.CreateVector<" + type + ">(" + value +
                    ".size(), [](size_t i, _VectorArgs *__va) { return " +
                    enum_value + "; }, &_va)";
            break;
          }
          default: {
            if (field.value.type.enum_def &&
                !VectorElementUserFacing(vector_type)) {
              // For enumerations, we need to get access to the array data for
              // the underlying storage type (eg. uint8_t).
              const auto basetype = GenTypeBasic(
                  field.value.type.enum_def->underlying_type, false);
              code += "_fbb.CreateVectorScalarCast<" + basetype +
                      ">(::flatbuffers::data(" + value + "), " + value +
                      ".size())";
            } else if (field.attributes.Lookup("cpp_type")) {
              auto type = GenTypeBasic(vector_type, false);
              code += "_fbb.CreateVector<" + type + ">(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code += "return __va->__rehasher ? ";
              code += "static_cast<" + type + ">((*__va->__rehasher)";
              code += "(__va->_" + value + "[i]" + GenPtrGet(field) + ")) : 0";
              code += "; }, &_va )";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
                code += "_fbb.CreateVector64(" + value + ")";
              } else {
                code += "_fbb.CreateVector";
                if (field.offset64) {
                  // This is normal 32-bit vector, with 64-bit addressing.
                  code += "64<::flatbuffers::Vector>";
                }
                code += "(" + value + ")";
              }
            }
            break;
          }
        }

        // If set_empty_vectors_to_null option is enabled, for optional fields,
        // check to see if there actually is any data in _o->field before
        // attempting to access it.
        if (field.attributes.Lookup("nested_flatbuffer") ||
            (opts_.set_empty_vectors_to_null && !field.IsRequired())) {
          code = value + ".size() ? " + code + " : 0";
        }
        break;
      }
      case BASE_TYPE_UNION: {
        // _o->field.Pack(_fbb);
        code += value + ".Pack(_fbb)";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (IsStruct(field.value.type)) {
          const auto &struct_attribs = field.value.type.struct_def->attributes;
          const auto native_type = struct_attribs.Lookup("native_type");
          if (native_type) {
            code += "::flatbuffers::Pack";
            const auto pack_name =
                struct_attribs.Lookup("native_type_pack_name");
            if (pack_name) { code += pack_name->constant; }
            code += "(" + value + ")";
          } else if (field.native_inline) {
            code += "&" + value;
          } else {
            code += value + " ? " + value + GenPtrGet(field) + " : nullptr";
          }
        } else {
          // _o->field ? CreateT(_fbb, _o->field.get(), _rehasher);
          const std::string &type = field.value.type.struct_def->name;
          code += value + " ? Create" + type;
          code += "(_fbb, " + value;
          if (!field.native_inline) code += GenPtrGet(field);
          code += ", _rehasher) : 0";
        }
        break;
      }
      default: {
        code += value;
        break;
      }
    }
    return code;
  }